

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorDisposer.cpp
# Opt level: O1

void __thiscall
ApprovalTests::ComparatorDisposer::ComparatorDisposer
          (ComparatorDisposer *this,ComparatorContainer *comparators_,string *extensionWithDot,
          shared_ptr<ApprovalTests::ApprovalComparator> *previousComparator_,
          shared_ptr<ApprovalTests::ApprovalComparator> *newComparator)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  mapped_type *pmVar5;
  
  this->isActive = true;
  this->comparators = comparators_;
  (this->ext_)._M_dataplus._M_p = (pointer)&(this->ext_).field_2;
  pcVar1 = (extensionWithDot->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ext_,pcVar1,pcVar1 + extensionWithDot->_M_string_length);
  (this->previousComparator).
  super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (previousComparator_->
           super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  p_Var2 = (previousComparator_->
           super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (previousComparator_->
  super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->previousComparator).
  super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->previousComparator).
  super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (previousComparator_->
  super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
           ::operator[](comparators_,extensionWithDot);
  peVar3 = (newComparator->
           super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  p_Var4 = (newComparator->
           super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (newComparator->super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>)
  ._M_ptr = (element_type *)0x0;
  (newComparator->super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>)
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (pmVar5->
           super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (pmVar5->super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
       = peVar3;
  (pmVar5->super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = p_Var4;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return;
  }
  return;
}

Assistant:

ComparatorDisposer::ComparatorDisposer(
        ComparatorContainer& comparators_,
        const std::string& extensionWithDot,
        std::shared_ptr<ApprovalTests::ApprovalComparator> previousComparator_,
        std::shared_ptr<ApprovalTests::ApprovalComparator> newComparator)
        : comparators(comparators_)
        , ext_(extensionWithDot)
        , previousComparator(std::move(previousComparator_))
    {
        comparators_[extensionWithDot] = std::move(newComparator);
    }